

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

ON_SubDMeshFragmentGrid *
ON_SubDMeshFragmentGrid::QuadGridFromDisplayDensity
          (ON_SubDMeshFragmentGrid *__return_storage_ptr__,uint display_density,
          uint mesh_density_reduction)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uchar *puVar3;
  uint uVar4;
  uint side_segment_count;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ON_SubDMeshFragmentGrid *pOVar8;
  ON_SubDMeshFragmentGrid *pOVar9;
  bool bVar10;
  ON_SubDMeshFragmentGrid *local_118;
  uint grid_S_capacity;
  uint grid_F_capacity;
  uint s2_1;
  ON_SubDMeshFragmentGrid *prev_lod;
  ON_SubDMeshFragmentGrid *first_lod;
  uint s1_1;
  uint i_1;
  uint *vdex;
  uint *vdex1;
  uint *vdex0;
  ON_SubDMeshFragmentGrid grid;
  ON_SubDMeshFragmentGrid *local_70;
  ON_SubDMeshFragmentGrid *grids;
  size_t sz2;
  size_t sz1;
  uint vdex_capacity;
  uint local_44;
  uint s2;
  uint s1;
  uint i;
  uint grid_cache_index1;
  uint grid_cache_index0;
  uint grid_count;
  uint side_segment_capacity;
  uint quad_capacity;
  ON_MemoryAllocationTracking disable_tracking;
  bool bReturnLock;
  ON_SubDMeshFragmentGrid *fragment_grid;
  uint mesh_density_reduction_local;
  uint display_density_local;
  
  if (display_density < 9) {
    unique0x00012000 = QuadGridFromDisplayDensity::grid_cache[display_density];
    if (unique0x00012000 == (ON_SubDMeshFragmentGrid *)0x0) {
      disable_tracking.m_this_statck_depth._3_1_ =
           ON_SleepLock::GetLock(&QuadGridFromDisplayDensity::lock,0x32,60000,true);
      unique0x00012000 = QuadGridFromDisplayDensity::grid_cache[display_density];
      if (unique0x00012000 == (ON_SubDMeshFragmentGrid *)0x0) {
        ON_MemoryAllocationTracking::ON_MemoryAllocationTracking
                  ((ON_MemoryAllocationTracking *)&side_segment_capacity,false);
        grid_count = 0;
        grid_cache_index0 = 0;
        grid_cache_index1 = 0;
        s1 = display_density;
        i = display_density;
        if (display_density < 5) {
          i = 0;
          s1 = 4;
        }
        for (s2 = i; s2 <= s1; s2 = s2 + 1) {
          for (local_44 = 1 << ((byte)s2 & 0x1f); local_44 != 0; local_44 = local_44 >> 1) {
            uVar4 = ON_SubDMeshFragment::QuadGridQuadCountFromSideCount(local_44);
            grid_count = uVar4 + grid_count;
            grid_cache_index0 = local_44 * 4 + 1 + grid_cache_index0;
            grid_cache_index1 = grid_cache_index1 + 1;
          }
        }
        uVar4 = grid_count * 4 + grid_cache_index0;
        grids = (ON_SubDMeshFragmentGrid *)((ulong)uVar4 << 2);
        if ((ulong)grids % 0x30 != 0) {
          grids = (ON_SubDMeshFragmentGrid *)(((ulong)grids / 0x30 + 1) * 0x30);
        }
        auVar1._8_8_ = 0;
        auVar1._0_8_ = grids + grid_cache_index1;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = SUB168(auVar1 / ZEXT816(0x30),0);
        uVar7 = SUB168(auVar2 * ZEXT816(0x30),0);
        if (SUB168(auVar2 * ZEXT816(0x30),8) != 0) {
          uVar7 = 0xffffffffffffffff;
        }
        pOVar8 = (ON_SubDMeshFragmentGrid *)operator_new__(uVar7,(nothrow_t *)&std::nothrow);
        grid.m_next_level_of_detail._7_1_ = pOVar8 != (ON_SubDMeshFragmentGrid *)0x0;
        local_118 = (ON_SubDMeshFragmentGrid *)0x0;
        if ((bool)grid.m_next_level_of_detail._7_1_) {
          local_118 = pOVar8;
        }
        local_70 = local_118;
        memcpy(&vdex0,&Empty,0x30);
        grid.m_reserved1 = '\x04';
        grid.m_reserved2 = '\0';
        _s1_1 = local_118 + grid_cache_index1;
        puVar3 = &_s1_1->m_reserved1;
        for (first_lod._4_4_ = i; pOVar8 = local_70, first_lod._4_4_ <= s1;
            first_lod._4_4_ = first_lod._4_4_ + 1) {
          _grid_F_capacity = (ON_SubDMeshFragmentGrid *)0x0;
          vdex0._6_2_ = 0;
          side_segment_count = 1 << ((byte)first_lod._4_4_ & 0x1f);
          for (grid_S_capacity = side_segment_count; grid_S_capacity != 0;
              grid_S_capacity = grid_S_capacity >> 1) {
            uVar5 = ON_SubDMeshFragment::QuadGridQuadCountFromSideCount(grid_S_capacity);
            uVar6 = grid_S_capacity * 4 + 1;
            vdex0._2_1_ = (undefined1)grid_S_capacity;
            vdex0._4_2_ = (ushort)uVar5;
            grid._8_8_ = _s1_1;
            grid.m_F = (uint *)(&_s1_1->m_reserved1 + (ulong)(uVar5 << 2) * 4);
            pOVar9 = (ON_SubDMeshFragmentGrid *)((long)grid.m_F + (ulong)uVar6 * 4);
            if ((ON_SubDMeshFragmentGrid *)(puVar3 + (ulong)uVar4 * 4) < pOVar9) {
              ON_SubDIncrementErrorCount();
              _s1_1 = pOVar9;
              break;
            }
            SetQuads(side_segment_count,(uint)vdex0._6_2_,(uint *)_s1_1,(ulong)uVar5,
                     (ulong)(ushort)grid._0_2_,grid.m_F,(ulong)uVar6,1);
            memcpy(local_70,&vdex0,0x30);
            if (_grid_F_capacity != (ON_SubDMeshFragmentGrid *)0x0) {
              local_70->m_prev_level_of_detail = _grid_F_capacity;
              _grid_F_capacity->m_next_level_of_detail = local_70;
            }
            _grid_F_capacity = local_70;
            grid._8_8_ = grid._8_8_ + (long)(int)((uint)vdex0._4_2_ * (uint)(ushort)grid._0_2_) * 4;
            vdex0._6_2_ = vdex0._6_2_ + 1;
            local_70 = local_70 + 1;
            _s1_1 = pOVar9;
          }
          QuadGridFromDisplayDensity::grid_cache[first_lod._4_4_] = pOVar8;
        }
        if ((disable_tracking.m_this_statck_depth._3_1_ & 1) != 0) {
          ON_SleepLock::ReturnLock(&QuadGridFromDisplayDensity::lock);
        }
        if (_s1_1 != (ON_SubDMeshFragmentGrid *)(puVar3 + (ulong)uVar4 * 4)) {
          ON_SubDIncrementErrorCount();
        }
        unique0x00012000 = QuadGridFromDisplayDensity::grid_cache[display_density];
        if (unique0x00012000 == (ON_SubDMeshFragmentGrid *)0x0) {
          ON_SubDIncrementErrorCount();
          memcpy(__return_storage_ptr__,&Empty,0x30);
        }
        else {
          while( true ) {
            bVar10 = false;
            if (stack0xffffffffffffffe8->m_F_level_of_detail < mesh_density_reduction) {
              bVar10 = stack0xffffffffffffffe8->m_next_level_of_detail !=
                       (ON_SubDMeshFragmentGrid *)0x0;
            }
            if (!bVar10) break;
            unique0x00012000 = stack0xffffffffffffffe8->m_next_level_of_detail;
          }
          memcpy(__return_storage_ptr__,stack0xffffffffffffffe8,0x30);
        }
        ON_MemoryAllocationTracking::~ON_MemoryAllocationTracking
                  ((ON_MemoryAllocationTracking *)&side_segment_capacity);
      }
      else {
        ON_SleepLock::ReturnLock(&QuadGridFromDisplayDensity::lock);
        while( true ) {
          bVar10 = false;
          if (stack0xffffffffffffffe8->m_F_level_of_detail < mesh_density_reduction) {
            bVar10 = stack0xffffffffffffffe8->m_next_level_of_detail !=
                     (ON_SubDMeshFragmentGrid *)0x0;
          }
          if (!bVar10) break;
          unique0x00012000 = stack0xffffffffffffffe8->m_next_level_of_detail;
        }
        memcpy(__return_storage_ptr__,stack0xffffffffffffffe8,0x30);
      }
    }
    else {
      while( true ) {
        bVar10 = false;
        if (stack0xffffffffffffffe8->m_F_level_of_detail < mesh_density_reduction) {
          bVar10 = stack0xffffffffffffffe8->m_next_level_of_detail != (ON_SubDMeshFragmentGrid *)0x0
          ;
        }
        if (!bVar10) break;
        unique0x00012000 = stack0xffffffffffffffe8->m_next_level_of_detail;
      }
      memcpy(__return_storage_ptr__,stack0xffffffffffffffe8,0x30);
    }
  }
  else {
    ON_SubDIncrementErrorCount();
    memcpy(__return_storage_ptr__,&Empty,0x30);
  }
  return __return_storage_ptr__;
}

Assistant:

ON_SubDMeshFragmentGrid ON_SubDMeshFragmentGrid::QuadGridFromDisplayDensity(
  unsigned int display_density,
  unsigned int mesh_density_reduction
  )
{
  static const ON_SubDMeshFragmentGrid* grid_cache[9] = { 0 }; // side_segment_count = 1,2,4,8,16,32,64,128,256

  if ( ((size_t)display_density) >= sizeof(grid_cache)/sizeof(grid_cache[0]))
    return ON_SUBD_RETURN_ERROR(ON_SubDMeshFragmentGrid::Empty);

  const ON_SubDMeshFragmentGrid* fragment_grid = grid_cache[display_density];
  if (nullptr != fragment_grid)
  {
    while ( fragment_grid->m_F_level_of_detail < mesh_density_reduction && nullptr != fragment_grid->m_next_level_of_detail)
      fragment_grid = fragment_grid->m_next_level_of_detail;
    return *fragment_grid;
  }

  // The code below is thread safe and constructs the ON_SubDLimitMeshFragmentGrids
  // that are resources shared by all ON_SubDLimitMeshFragments.

  static ON_SleepLock lock;
  const bool bReturnLock = lock.GetLock(50,ON_SleepLock::OneMinute,true);

  // try again in case cache was made while waiting
  fragment_grid = grid_cache[display_density];
  if (nullptr != fragment_grid)
  {
    lock.ReturnLock();
    while ( fragment_grid->m_F_level_of_detail < mesh_density_reduction && nullptr != fragment_grid->m_next_level_of_detail)
      fragment_grid = fragment_grid->m_next_level_of_detail;
    return *fragment_grid;
  }

  // The ON_SubDMeshFragmentGrid classes created below are created one time as needed
  // and used millions of times after that. These are app workspace allocations
  // and not memory leaks. Once a grid exists, it is saved in grid_cache[] and returned
  // above the next zillion times it is required.
  ON_MemoryAllocationTracking disable_tracking(false);

  // make the requested grid
  unsigned int quad_capacity = 0;
  unsigned int side_segment_capacity = 0;
  unsigned int grid_count = 0;
  unsigned int grid_cache_index0 = display_density;
  unsigned int grid_cache_index1 = display_density;
  if (display_density <= ON_SubDDisplayParameters::DefaultDensity)
  {
    // make all the common small grids
    grid_cache_index0 = 0;
    grid_cache_index1 = ON_SubDDisplayParameters::DefaultDensity;
  }
  for (unsigned int i = grid_cache_index0; i <= grid_cache_index1; i++)
  {
    // allocate all levels of detail for each segment side count
    unsigned int s1 = (1U << i);
    for (unsigned int s2 = s1; s2 > 0; s2 /= 2)
    {
      quad_capacity += ON_SubDMeshFragment::QuadGridQuadCountFromSideCount(s2);
      side_segment_capacity += 4*s2 + 1;
      grid_count++;
    }
  }


  const unsigned int vdex_capacity = (quad_capacity*4 + side_segment_capacity);
  size_t sz1 = grid_count*sizeof(ON_SubDMeshFragmentGrid);
  size_t sz2 = vdex_capacity*sizeof(unsigned int);
  if (0 != sz2 % sizeof(ON_SubDMeshFragmentGrid))
    sz2 = (1 + sz2/sizeof(ON_SubDMeshFragmentGrid))*sizeof(ON_SubDMeshFragmentGrid);
  ON_SubDMeshFragmentGrid* grids = new (std::nothrow) ON_SubDMeshFragmentGrid[(sz1 + sz2)/sizeof(ON_SubDMeshFragmentGrid)];

  ON_SubDMeshFragmentGrid grid = ON_SubDMeshFragmentGrid::Empty;
  grid.m_F_stride = 4;
  unsigned int* vdex0 = (unsigned int*)(grids + grid_count);
  unsigned int* vdex1 = vdex0 + vdex_capacity;
  unsigned int* vdex = vdex0;

  for (unsigned int i = grid_cache_index0; i <= grid_cache_index1; i++)
  {
    const unsigned int s1 = (1U << i);
    ON_SubDMeshFragmentGrid* first_lod = grids;
    ON_SubDMeshFragmentGrid* prev_lod = nullptr;
    grid.m_F_level_of_detail = 0;
    for (unsigned int s2 = s1; s2 > 0; s2 /= 2, grids++)
    {
      const unsigned int grid_F_capacity = ON_SubDMeshFragment::QuadGridQuadCountFromSideCount(s2);
      const unsigned int grid_S_capacity = 4*s2 + 1;

      grid.m_side_segment_count = (unsigned char)s2;
      grid.m_F_count = (unsigned short)grid_F_capacity;
      grid.m_F = vdex;
      vdex += 4*grid_F_capacity;
      grid.m_S = vdex;
      vdex += grid_S_capacity;

      if (vdex > vdex1)
      {
        ON_SubDIncrementErrorCount();
        break;
      }

      ON_SubDMeshFragmentGrid::SetQuads(
        s1, // top level side_segment_count
        grid.m_F_level_of_detail,
        const_cast<unsigned int*>(grid.m_F),
        grid_F_capacity,
        grid.m_F_stride,
        const_cast<unsigned int*>(grid.m_S),
        grid_S_capacity,
        1U
        );

      *grids = grid;
      if ( nullptr != prev_lod )
      {
        grids->m_prev_level_of_detail = prev_lod;
        prev_lod->m_next_level_of_detail = grids;
      }
      prev_lod = grids;

      grid.m_F += (grid.m_F_count*grid.m_F_stride);
      grid.m_F_level_of_detail++;
    }

    // Do not initialize grid_cache[i] until entire linked list is ready to be used.
    // This way if the lock is stolen for some unforeseen reason, we risk leaking memory
    // but we will not crash.
    grid_cache[i] = first_lod;
  }

  if ( bReturnLock )
    lock.ReturnLock();

  if (vdex != vdex1)
  {
    ON_SubDIncrementErrorCount();
  }

  fragment_grid = grid_cache[display_density];
  if (nullptr != fragment_grid)
  {
    while ( fragment_grid->m_F_level_of_detail < mesh_density_reduction && nullptr != fragment_grid->m_next_level_of_detail)
      fragment_grid = fragment_grid->m_next_level_of_detail;
    return *fragment_grid;
  }

  return ON_SUBD_RETURN_ERROR(ON_SubDMeshFragmentGrid::Empty);
}